

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::BlobProto::MergePartialFromCodedStream(BlobProto *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  int byte_limit;
  BlobShape *this_00;
  pair<int,_int> pVar7;
  RepeatedField<float> *pRVar8;
  RepeatedField<double> *pRVar9;
  UnknownFieldSet *unknown_fields;
  char cVar10;
  uint tag;
  ulong uVar11;
  
LAB_003ef3a4:
  pbVar2 = input->buffer_;
  uVar6 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar6 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_003ef3c8;
    input->buffer_ = pbVar2 + 1;
    uVar11 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_003ef3c8:
    uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
    uVar11 = 0;
    if (uVar6 - 1 < 0x7f) {
      uVar11 = 0x100000000;
    }
    uVar11 = uVar6 | uVar11;
  }
  tag = (uint)uVar11;
  if ((uVar11 & 0x100000000) == 0) goto switchD_003ef443_default;
  cVar10 = (char)uVar11;
  switch((uint)(uVar11 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar10 == '\b') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar11 = (ulong)bVar1;
        uVar6 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003ef706;
        input->buffer_ = pbVar2 + 1;
      }
      else {
        uVar6 = 0;
LAB_003ef706:
        uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        if ((long)uVar11 < 0) {
          return false;
        }
      }
      this->num_ = (int32)uVar11;
      goto LAB_003ef3a4;
    }
    break;
  case 2:
    if (cVar10 == '\x10') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar11 = (ulong)bVar1;
        uVar6 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003ef723;
        input->buffer_ = pbVar2 + 1;
      }
      else {
        uVar6 = 0;
LAB_003ef723:
        uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        if ((long)uVar11 < 0) {
          return false;
        }
      }
      this->channels_ = (int32)uVar11;
      goto LAB_003ef3a4;
    }
    break;
  case 3:
    if (cVar10 == '\x18') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar11 = (ulong)bVar1;
        uVar6 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003ef6cc;
        input->buffer_ = pbVar2 + 1;
      }
      else {
        uVar6 = 0;
LAB_003ef6cc:
        uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        if ((long)uVar11 < 0) {
          return false;
        }
      }
      this->height_ = (int32)uVar11;
      goto LAB_003ef3a4;
    }
    break;
  case 4:
    if (cVar10 == ' ') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar11 = (ulong)bVar1;
        uVar6 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003ef6e9;
        input->buffer_ = pbVar2 + 1;
      }
      else {
        uVar6 = 0;
LAB_003ef6e9:
        uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        if ((long)uVar11 < 0) {
          return false;
        }
      }
      this->width_ = (int32)uVar11;
      goto LAB_003ef3a4;
    }
    break;
  case 5:
    if (cVar10 == '-') {
      uVar6 = 0x2a;
      pRVar8 = &this->data_;
LAB_003ef629:
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadRepeatedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (1,uVar6,input,pRVar8);
    }
    else {
      pRVar8 = &this->data_;
      if ((tag & 0xff) != 0x2a) break;
LAB_003ef56f:
      bVar5 = google::protobuf::internal::WireFormatLite::
              ReadPackedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (input,pRVar8);
    }
    goto LAB_003ef41f;
  case 6:
    if (cVar10 == '5') {
      uVar6 = 0x32;
      pRVar8 = &this->diff_;
      goto LAB_003ef629;
    }
    pRVar8 = &this->diff_;
    if ((tag & 0xff) == 0x32) goto LAB_003ef56f;
    break;
  case 7:
    if (cVar10 != ':') break;
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
    this_00 = this->shape_;
    if (this_00 == (BlobShape *)0x0) {
      this_00 = (BlobShape *)operator_new(0x30);
      BlobShape::BlobShape(this_00);
      this->shape_ = this_00;
    }
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) && (byte_limit = (int)(char)*puVar4, -1 < byte_limit)) {
      input->buffer_ = puVar4 + 1;
    }
    else {
      byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (byte_limit < 0) {
        return false;
      }
    }
    pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                      (input,byte_limit);
    if ((long)pVar7 < 0) {
      return false;
    }
    bVar5 = BlobShape::MergePartialFromCodedStream(this_00,input);
    if (!bVar5) {
      return false;
    }
    bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar7.first);
    if (!bVar5) {
      return false;
    }
    goto LAB_003ef3a4;
  case 8:
    if (cVar10 != 'A') {
      pRVar9 = &this->double_data_;
      if ((tag & 0xff) == 0x42) {
LAB_003ef5e6:
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,pRVar9);
        goto LAB_003ef41f;
      }
      break;
    }
    uVar6 = 0x42;
    pRVar9 = &this->double_data_;
LAB_003ef643:
    bVar5 = google::protobuf::internal::WireFormatLite::
            ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                      (1,uVar6,input,pRVar9);
    goto LAB_003ef41f;
  case 9:
    if (cVar10 == 'I') {
      uVar6 = 0x4a;
      pRVar9 = &this->double_diff_;
      goto LAB_003ef643;
    }
    pRVar9 = &this->double_diff_;
    if ((tag & 0xff) == 0x4a) goto LAB_003ef5e6;
  }
switchD_003ef443_default:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) == 0) {
    unknown_fields =
         google::protobuf::internal::
         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
         ::mutable_unknown_fields_slow
                   (&(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   );
  }
  else {
    unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  bVar5 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
LAB_003ef41f:
  if (bVar5 == false) {
    return false;
  }
  goto LAB_003ef3a4;
}

Assistant:

bool BlobProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.BlobProto)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 num = 1 [default = 0];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_num();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &num_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 channels = 2 [default = 0];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_channels();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &channels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 height = 3 [default = 0];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_height();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 width = 4 [default = 0];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_width();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated float data = 5 [packed = true];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_data())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(45u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 42u, input, this->mutable_data())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated float diff = 6 [packed = true];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_diff())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(53u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 50u, input, this->mutable_diff())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.BlobShape shape = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_shape()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double double_data = 8 [packed = true];
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_double_data())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(65u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 66u, input, this->mutable_double_data())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double double_diff = 9 [packed = true];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_double_diff())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(73u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 74u, input, this->mutable_double_diff())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.BlobProto)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.BlobProto)
  return false;
#undef DO_
}